

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_maximum_work_group_sizes
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar3;
  RenderContext *pRVar4;
  ostream *poVar5;
  ProgramSources *sources;
  TestLog *pTVar6;
  ProgramInfo *pPVar7;
  ShaderInfo *pSVar8;
  MessageBuilder *this;
  byte local_649;
  char *local_5c0;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  MessageBuilder local_568;
  char *local_3e8;
  char *message;
  string local_3d8;
  byte local_3b1;
  undefined1 local_3b0 [7];
  bool testFailed;
  undefined1 local_2e0 [8];
  ShaderProgram program;
  undefined1 local_1f0 [8];
  ComputeSource compSource;
  ostringstream local_1b8 [8];
  ostringstream compShaderSource;
  int testCase;
  char *shaderVersion;
  GLint local_20;
  int iStack_1c;
  bool isES32;
  GLint maxWorkGroupInvocations;
  GLint maxWorkGroupSizeZ;
  GLint maxWorkGroupSizeY;
  GLint maxWorkGroupSizeX;
  NegativeTestContext *ctx_local;
  
  _maxWorkGroupSizeY = ctx;
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,0,&maxWorkGroupSizeZ);
  NegativeTestContext::expectError(_maxWorkGroupSizeY,0);
  glu::CallLogWrapper::glGetIntegeri_v
            (&_maxWorkGroupSizeY->super_CallLogWrapper,0x91bf,1,&maxWorkGroupInvocations);
  NegativeTestContext::expectError(_maxWorkGroupSizeY,0);
  glu::CallLogWrapper::glGetIntegeri_v
            (&_maxWorkGroupSizeY->super_CallLogWrapper,0x91bf,2,&stack0xffffffffffffffe4);
  NegativeTestContext::expectError(_maxWorkGroupSizeY,0);
  glu::CallLogWrapper::glGetIntegerv(&_maxWorkGroupSizeY->super_CallLogWrapper,0x90eb,&local_20);
  NegativeTestContext::expectError(_maxWorkGroupSizeY,0);
  pRVar4 = NegativeTestContext::getRenderContext(_maxWorkGroupSizeY);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar2) {
    local_5c0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_5c0 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  if ((NegativeTestShared::(anonymous_namespace)::
       invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
       ::localWorkGroupSizeCases == '\0') &&
     (iVar3 = __cxa_guard_acquire(&NegativeTestShared::(anonymous_namespace)::
                                   invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
                                   ::localWorkGroupSizeCases), iVar3 != 0)) {
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[0].x = maxWorkGroupSizeZ + 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[0].y = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[0].z = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[1].x = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[1].y = maxWorkGroupInvocations + 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[1].z = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[2].x = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[2].y = 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[2].z = iStack_1c + 1;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].x = maxWorkGroupSizeZ;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].y = maxWorkGroupInvocations;
    invalid_maximum_work_group_sizes::localWorkGroupSizeCases[3].z = iStack_1c;
    __cxa_guard_release(&NegativeTestShared::(anonymous_namespace)::
                         invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
                         ::localWorkGroupSizeCases);
  }
  for (compShaderSource._372_4_ = 0; (int)compShaderSource._372_4_ < 4;
      compShaderSource._372_4_ = compShaderSource._372_4_ + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar5 = std::operator<<((ostream *)local_1b8,local_5c0);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(local_size_x = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,invalid_maximum_work_group_sizes::localWorkGroupSizeCases
                               [(int)compShaderSource._372_4_].x);
    poVar5 = std::operator<<(poVar5,", local_size_y = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,invalid_maximum_work_group_sizes::localWorkGroupSizeCases
                               [(int)compShaderSource._372_4_].y);
    poVar5 = std::operator<<(poVar5,", local_size_z = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,invalid_maximum_work_group_sizes::localWorkGroupSizeCases
                               [(int)compShaderSource._372_4_].z);
    poVar5 = std::operator<<(poVar5,") in;\n");
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::ostringstream::str();
    glu::ComputeSource::ComputeSource
              ((ComputeSource *)local_1f0,(string *)&program.m_program.m_info.linkTimeUs);
    std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
    pRVar4 = NegativeTestContext::getRenderContext(_maxWorkGroupSizeY);
    glu::ProgramSources::ProgramSources((ProgramSources *)local_3b0);
    sources = glu::ProgramSources::operator<<((ProgramSources *)local_3b0,(ShaderSource *)local_1f0)
    ;
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2e0,pRVar4,sources);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_3b0);
    pNVar1 = _maxWorkGroupSizeY;
    if (compShaderSource._372_4_ == 3) {
      local_3b1 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,
                 "A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS."
                 ,(allocator<char> *)((long)&message + 7));
      NegativeTestContext::beginSection(pNVar1,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&message + 7));
      pTVar6 = glu::CallLogWrapper::getLog(&_maxWorkGroupSizeY->super_CallLogWrapper);
      glu::operator<<(pTVar6,(ShaderProgram *)local_2e0);
      pPVar7 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_2e0);
      local_649 = 0;
      if ((pPVar7->linkOk & 1U) != 0) {
        pSVar8 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_2e0,SHADERTYPE_COMPUTE,0);
        local_649 = pSVar8->compileOk;
      }
      local_3b1 = local_649 & 1;
      if (local_3b1 != 0) {
        local_3e8 = "Program was not expected to compile or link.";
        pTVar6 = glu::CallLogWrapper::getLog(&_maxWorkGroupSizeY->super_CallLogWrapper);
        tcu::TestLog::operator<<(&local_568,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        this = tcu::MessageBuilder::operator<<(&local_568,&local_3e8);
        tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_568);
        pNVar1 = _maxWorkGroupSizeY;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"Program was not expected to compile or link.",&local_589);
        NegativeTestContext::fail(pNVar1,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b0,
                 "A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported."
                 ,&local_5b1);
      NegativeTestContext::beginSection(pNVar1,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator(&local_5b1);
      verifyCompileError(_maxWorkGroupSizeY,(ShaderProgram *)local_2e0,SHADERTYPE_COMPUTE);
    }
    NegativeTestContext::endSection(_maxWorkGroupSizeY);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2e0);
    glu::ComputeSource::~ComputeSource((ComputeSource *)local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return;
}

Assistant:

void invalid_maximum_work_group_sizes (NegativeTestContext& ctx)
{
	GLint maxWorkGroupSizeX;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)0, &maxWorkGroupSizeX);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeY;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)1, &maxWorkGroupSizeY);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeZ;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)2, &maxWorkGroupSizeZ);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupInvocations;
	ctx.glGetIntegerv(GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS, &maxWorkGroupInvocations);
	ctx.expectError(GL_NO_ERROR);

	DE_ASSERT((maxWorkGroupSizeX * maxWorkGroupSizeY * maxWorkGroupSizeZ) > maxWorkGroupInvocations );

	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	static const struct
	{
		GLint x;
		GLint y;
		GLint z;
	} localWorkGroupSizeCases[] =
	{
		{	maxWorkGroupSizeX+1,	1,						1						},
		{	1,						maxWorkGroupSizeY+1,	1						},
		{	1,						1,						maxWorkGroupSizeZ+1		},
		{	maxWorkGroupSizeX,		maxWorkGroupSizeY,		maxWorkGroupSizeZ		},
	};

	for (int testCase = 0; testCase < DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases); ++testCase)
	{
		std::ostringstream compShaderSource;

		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = " << localWorkGroupSizeCases[testCase].x << ", local_size_y = " << localWorkGroupSizeCases[testCase].y << ", local_size_z = " << localWorkGroupSizeCases[testCase].z << ") in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		if (testCase == DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases)-1)
		{
			bool testFailed = false;
			ctx.beginSection("A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS.");

			ctx.getLog() << program;
			testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

			if (testFailed)
			{
				const char* const message("Program was not expected to compile or link.");
				ctx.getLog() << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
				ctx.fail(message);
			}
		}
		else
		{
			ctx.beginSection("A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported.");
			verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		}

		ctx.endSection();
	}
}